

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

double __thiscall pstore::logger::log(logger *this,double __x)

{
  char *in_RCX;
  char *in_RDX;
  uint in_ESI;
  double dVar1;
  allocator local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&local_40,in_RDX,&local_a1);
  std::operator+(&local_a0,&local_40,'\"');
  std::operator+(&local_80,&local_a0,in_RCX);
  std::operator+(&local_60,&local_80,'\"');
  (*this->_vptr_logger[2])(this,(ulong)in_ESI,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  dVar1 = (double)std::__cxx11::string::~string((string *)&local_40);
  return dVar1;
}

Assistant:

void logger::log (priority const p, gsl::czstring const part1, quoted const part2) {
            this->log (p, std::string{part1} + '"' + static_cast<gsl::czstring> (part2) + '"');
        }